

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLWriter.h
# Opt level: O1

void __thiscall
cmXMLWriter::Attribute<std::__cxx11::string>
          (cmXMLWriter *this,char *name,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value)

{
  size_t sVar1;
  ostream *poVar2;
  char local_31;
  cmXMLSafe local_30;
  
  PreAttribute(this);
  poVar2 = this->Output;
  if (name == (char *)0x0) {
    std::ios::clear((int)poVar2 + (int)poVar2->_vptr_basic_ostream[-3]);
  }
  else {
    sVar1 = strlen(name);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,name,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"=\"",2);
  cmXMLSafe::cmXMLSafe(&local_30,value);
  poVar2 = operator<<(poVar2,&local_30);
  local_31 = '\"';
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_31,1);
  return;
}

Assistant:

void Attribute(const char* name, T const& value)
  {
    this->PreAttribute();
    this->Output << name << "=\"" << SafeAttribute(value) << '"';
  }